

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O1

uint32_t * unpack17_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  *out = (*in & 0x1ffff) + base;
  uVar1 = *in;
  out[1] = uVar1 >> 0x11;
  out[1] = (uVar1 >> 0x11) + base + (in[1] & 3) * 0x8000;
  out[2] = (in[1] >> 2 & 0x1ffff) + base;
  uVar1 = in[1];
  out[3] = uVar1 >> 0x13;
  out[3] = (uVar1 >> 0x13) + base + (in[2] & 0xf) * 0x2000;
  out[4] = (in[2] >> 4 & 0x1ffff) + base;
  uVar1 = in[2];
  out[5] = uVar1 >> 0x15;
  out[5] = (uVar1 >> 0x15) + base + (in[3] & 0x3f) * 0x800;
  out[6] = (in[3] >> 6 & 0x1ffff) + base;
  uVar1 = in[3];
  out[7] = uVar1 >> 0x17;
  out[7] = (uVar1 >> 0x17) + base + (in[4] & 0xff) * 0x200;
  return in + 5;
}

Assistant:

uint32_t * unpack17_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 17 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  17  ) ;
    ++in;
    *out |= ((*in) % (1U<< 2 ))<<( 17 - 2 );
    *out += base;
    out++;
    *out = ( (*in) >>  2  )   % (1U << 17 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  19  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 17 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 17 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  21  ) ;
    ++in;
    *out |= ((*in) % (1U<< 6 ))<<( 17 - 6 );
    *out += base;
    out++;
    *out = ( (*in) >>  6  )   % (1U << 17 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  23  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 17 - 8 );
    *out += base;
    out++;

    return in + 1;
}